

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O1

void print_NEWstring(LispPTR x)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  DLword *pDVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)x;
  if ((x & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
  }
  pDVar4 = Lisp_world;
  uVar1 = Lisp_world[uVar6 + 4];
  uVar5 = (uint)uVar1;
  uVar3 = *(uint *)(Lisp_world + uVar6);
  uVar2 = Lisp_world[uVar6 + 2];
  putchar(0x22);
  if (uVar1 != 0) {
    uVar6 = (long)pDVar4 + (ulong)uVar2 + (ulong)(uVar3 & 0xfffffff) * 2;
    do {
      putchar((uint)*(byte *)(uVar6 ^ 3));
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  putchar(0x22);
  return;
}

Assistant:

void print_NEWstring(LispPTR x) {
  NEWSTRINGP *string_point;
  DLword st_length;
  DLbyte *string_base;

  int i;

  string_point = (NEWSTRINGP *)NativeAligned4FromLAddr(x);
  st_length = string_point->fillpointer;
  string_base = (DLbyte *)NativeAligned2FromLAddr(string_point->base);
  string_base += string_point->offset;

  printf("%c", DOUBLEQUOTE); /* print %" */

  for (i = 0; i < st_length; i++) {
    printf("%c", GETBYTE(string_base));
    string_base++;
  }

  printf("%c", DOUBLEQUOTE); /* print %" */
}